

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O2

void __thiscall
InterpGCTest_Collect_Func_Test::~InterpGCTest_Collect_Func_Test
          (InterpGCTest_Collect_Func_Test *this)

{
  InterpTest::~InterpTest((InterpTest *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(InterpGCTest, Collect_Func) {
  ReadModule(s_fac_module);
  Instantiate();
  auto func = GetFuncExport(0);

  auto after_new = store_.object_count();
  EXPECT_EQ(before_new + 3, after_new);  // module, instance, func.

  // Reset module and instance roots, but they'll be kept alive by the func.
  mod_.reset();
  inst_.reset();
  store_.Collect();
  EXPECT_EQ(after_new, store_.object_count());
}